

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

void variance32_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m128i *sse,
                    __m128i *sum)

{
  int iVar1;
  bool bVar2;
  
  (*sum)[0] = 0;
  (*sum)[1] = 0;
  iVar1 = 0;
  if (0 < h) {
    iVar1 = h;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    variance16_kernel_sse2(src,ref,sse,sum);
    variance16_kernel_sse2(src + 0x10,ref + 0x10,sse,sum);
    src = src + src_stride;
    ref = ref + ref_stride;
  }
  return;
}

Assistant:

static inline void variance32_sse2(const uint8_t *src, const int src_stride,
                                   const uint8_t *ref, const int ref_stride,
                                   const int h, __m128i *const sse,
                                   __m128i *const sum) {
  assert(h <= 32);  // May overflow for larger height.
  // Don't initialize sse here since it's an accumulation.
  *sum = _mm_setzero_si128();

  for (int i = 0; i < h; ++i) {
    variance16_kernel_sse2(src + 0, ref + 0, sse, sum);
    variance16_kernel_sse2(src + 16, ref + 16, sse, sum);
    src += src_stride;
    ref += ref_stride;
  }
}